

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_35::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  Impl *pIVar2;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar3;
  uchar *puVar4;
  uchar *__src;
  ssize_t extraout_RAX;
  ssize_t sVar5;
  undefined4 in_register_00000034;
  Fault local_58;
  Fault f;
  uint64_t end;
  undefined1 local_38 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  uint64_t offset_local;
  InMemoryFile *this_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  lock.ptr = (Impl *)CONCAT44(in_register_00000034,__fd);
  this_local = (InMemoryFile *)__buf;
  data_local.ptr = (uchar *)__n;
  sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar1 == 0) {
    sVar5 = 0;
  }
  else {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    Impl::modified(pIVar2);
    pIVar2 = lock.ptr;
    sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    f.exception = (Exception *)((long)&pIVar2->clock + sVar1);
    if (f.exception < lock.ptr) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                (&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x346,FAILED,"end >= offset","\"write() request overflows uint64\"",
                 (char (*) [33])"write() request overflows uint64");
      _::Debug::Fault::fatal(&local_58);
    }
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    Impl::ensureCapacity(pIVar2,(size_t)f.exception);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    WVar3 = max<unsigned_long&,unsigned_long&>(&pIVar2->size,(unsigned_long *)&f);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    pIVar2->size = WVar3;
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    puVar4 = Array<unsigned_char>::begin(&pIVar2->bytes);
    puVar4 = puVar4 + (long)lock.ptr;
    __src = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
    sVar1 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    memcpy(puVar4,__src,sVar1);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    sVar5 = extraout_RAX;
  }
  return sVar5;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }